

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckRules.cpp
# Opt level: O0

bool __thiscall GdlGlyphDefn::DeleteBadGlyphs(GdlGlyphDefn *this)

{
  size_type_conflict sVar1;
  reference pvVar2;
  iterator __position;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  *in_RDI;
  int i;
  bool fRet;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_ffffffffffffffb8;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  *this_00;
  iterator in_stack_ffffffffffffffd0;
  int local_10;
  bool local_9;
  
  local_9 = false;
  sVar1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0xe));
  local_10 = (int)sVar1;
  while (local_10 = local_10 + -1, -1 < local_10) {
    pvVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0xe),
                        (long)local_10);
    if (*pvVar2 == 0xfffb) {
      this_00 = (__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                 *)(in_RDI + 0xe);
      __position = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                             (in_stack_ffffffffffffffb8);
      __gnu_cxx::
      __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
      ::operator+(in_RDI,(difference_type)this_00);
      __gnu_cxx::
      __normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>
      ::__normal_iterator<unsigned_short*>
                (this_00,(__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                          *)in_stack_ffffffffffffffb8);
      in_stack_ffffffffffffffd0 =
           std::vector<unsigned_short,_std::allocator<unsigned_short>_>::erase
                     (in_stack_ffffffffffffffd0._M_current,__position._M_current);
      local_9 = true;
    }
  }
  return local_9;
}

Assistant:

bool GdlGlyphDefn::DeleteBadGlyphs()
{
	bool fRet = false;
	for (int i = signed(m_vwGlyphIDs.size()) - 1; i >=0; i--)
	{
		if (m_vwGlyphIDs[i] == kBadGlyph)
		{
			m_vwGlyphIDs.erase(m_vwGlyphIDs.begin() + i);
			fRet = true;
		}
	}
	return fRet;
}